

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O0

void Ifd_ManStop(Ifd_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint local_1c;
  int Prev;
  int This;
  int i;
  Ifd_Man_t *p_local;
  
  local_1c = 0;
  for (Prev = 1; iVar1 = Vec_IntSize(p->vMarks), Prev < iVar1; Prev = Prev + 1) {
    uVar2 = Vec_IntEntry(p->vMarks,Prev);
    printf("%d(%d:%d) ",(ulong)(Prev - 1),(ulong)uVar2,(ulong)(uVar2 - local_1c));
    local_1c = uVar2;
  }
  printf("\n");
  Vec_IntFreeP(&p->vArgs);
  Vec_IntFreeP(&p->vRes);
  Vec_WrdFreeP(&p->vTruths);
  Vec_IntFreeP(&p->vClauses);
  Vec_IntFreeP(&p->vMarks);
  Hsh_IntManStop(p->vHash);
  Vec_IntFreeP(&p->vSuper);
  if (p->pObjs != (Ifd_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Ifd_Obj_t *)0x0;
  }
  if (p != (Ifd_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Ifd_ManStop( Ifd_Man_t * p )
{
    int i, This, Prev = 0;
    Vec_IntForEachEntryStart( p->vMarks, This, i, 1 )
    {
        printf( "%d(%d:%d) ", i-1, This, This - Prev );
        Prev = This;
    }
    printf( "\n" );

    Vec_IntFreeP( &p->vArgs );
    Vec_IntFreeP( &p->vRes );
    Vec_WrdFreeP( &p->vTruths );
    Vec_IntFreeP( &p->vClauses );
    Vec_IntFreeP( &p->vMarks );
    Hsh_IntManStop( p->vHash );
    Vec_IntFreeP( &p->vSuper );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}